

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O0

size_t xmi_process_EVNT(PBuffer *buffer,MidiFile *midi)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  uint64_t uVar4;
  size_t sVar5;
  int iVar6;
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  shared_ptr<Buffer> local_90;
  uint64_t local_80;
  uint64_t length;
  MidiNode subnode;
  uint8_t data1;
  undefined1 local_48 [8];
  MidiNode node;
  uint8_t type;
  uint64_t uStack_20;
  uint time_index;
  uint64_t time;
  MidiFile *midi_local;
  PBuffer *buffer_local;
  
  uStack_20 = 0;
  node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  do {
    while( true ) {
      peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          buffer);
      bVar1 = Buffer::readable(peVar3);
      if (!bVar1) {
        peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )buffer);
        sVar5 = Buffer::get_size(peVar3);
        return sVar5;
      }
      peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          buffer);
      node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
           Buffer::pop<unsigned_char>(peVar3);
      if ((node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _3_1_ & 0x80) != 0) break;
      uStack_20 = node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._3_1_ + uStack_20;
    }
    ConvertorXMI2MID::MidiNode::MidiNode((MidiNode *)local_48);
    local_48 = (undefined1  [8])uStack_20;
    iVar6 = node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ + 1;
    node.time._0_4_ =
         node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
    node.time._4_1_ =
         node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_;
    bVar2 = node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _3_1_ & 0xf0;
    node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         iVar6;
    if ((((bVar2 == 0x80) || (bVar2 == 0x90)) || (bVar2 == 0xa0)) || (bVar2 == 0xb0)) {
LAB_00164201:
      peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          buffer);
      node.time._5_1_ = Buffer::pop<unsigned_char>(peVar3);
      peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          buffer);
      node.time._6_1_ = Buffer::pop<unsigned_char>(peVar3);
      if ((node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _3_1_ & 0xf0) == 0x90) {
        subnode.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _3_1_ = node.time._5_1_;
        std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::
        push_back(&midi->nodes,(value_type *)local_48);
        ConvertorXMI2MID::MidiNode::MidiNode((MidiNode *)&length);
        subnode.time._4_1_ =
             node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _3_1_;
        std::shared_ptr<Buffer>::shared_ptr(&local_90,buffer);
        uVar4 = midi_read_variable_size(&local_90);
        std::shared_ptr<Buffer>::~shared_ptr(&local_90);
        length = uStack_20 + uVar4;
        subnode.time._0_4_ =
             node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _4_4_;
        subnode.time._5_1_ =
             subnode.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ._3_1_;
        subnode.time._6_1_ = 0;
        local_80 = uVar4;
        node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
             node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _4_4_ + 1;
        ConvertorXMI2MID::MidiNode::operator=((MidiNode *)local_48,(MidiNode *)&length);
        ConvertorXMI2MID::MidiNode::~MidiNode((MidiNode *)&length);
      }
    }
    else if ((bVar2 == 0xc0) || (bVar2 == 0xd0)) {
      peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          buffer);
      node.time._5_1_ = Buffer::pop<unsigned_char>(peVar3);
      node.time._6_1_ = 0;
    }
    else {
      if (bVar2 == 0xe0) goto LAB_00164201;
      if ((bVar2 == 0xf0) &&
         (node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_
          == 0xff)) {
        peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )buffer);
        node.time._5_1_ = Buffer::pop<unsigned_char>(peVar3);
        peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )buffer);
        node.time._6_1_ = Buffer::pop<unsigned_char>(peVar3);
        peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )buffer);
        Buffer::pop((Buffer *)local_a0,(size_t)peVar3);
        std::shared_ptr<Buffer>::operator=
                  ((shared_ptr<Buffer> *)&node.index,(shared_ptr<Buffer> *)local_a0);
        std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_a0);
        if ((node.time._5_1_ == 'Q') && (midi->tempo == 0)) {
          for (local_a4 = 0; local_a4 < (int)(uint)node.time._6_1_; local_a4 = local_a4 + 1) {
            midi->tempo = midi->tempo << 8;
            peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&node.index);
            bVar2 = Buffer::pop<unsigned_char>(peVar3);
            midi->tempo = (uint)bVar2 | midi->tempo;
          }
        }
      }
    }
    std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::push_back
              (&midi->nodes,(value_type *)local_48);
    ConvertorXMI2MID::MidiNode::~MidiNode((MidiNode *)local_48);
  } while( true );
}

Assistant:

static size_t
xmi_process_EVNT(PBuffer buffer, MidiFile *midi) {
  uint64_t time = 0;
  unsigned int time_index = 0;

  while (buffer->readable()) {
    uint8_t type = buffer->pop<uint8_t>();

    if (type & 0x80) {
      ConvertorXMI2MID::MidiNode node;
      node.time = time;
      node.index = time_index++;
      node.type = type;

      switch (type & 0xF0) {
        case 0x80:
        case 0x90:
        case 0xA0:
        case 0xB0:
        case 0xE0:
          node.data1 = buffer->pop<uint8_t>();
          node.data2 = buffer->pop<uint8_t>();
          if ((type & 0xF0) == 0x90) {
            uint8_t data1 = node.data1;
            midi->nodes.push_back(node);

            ConvertorXMI2MID::MidiNode subnode;
            subnode.type = type;
            uint64_t length = midi_read_variable_size(buffer);

            // Generate on note with velocity zero corresponding to off note.
            subnode.time = time + length;
            subnode.index = time_index++;
            subnode.data1 = data1;
            subnode.data2 = 0;
            node = subnode;
          }
          break;
        case 0xC0:
        case 0xD0:
          node.data1 = buffer->pop<uint8_t>();
          node.data2 = 0;
          break;
        case 0xF0:
          if (type == 0xFF) {  // Meta message.
            node.data1 = buffer->pop<uint8_t>();
            node.data2 = buffer->pop<uint8_t>();
            node.buffer = buffer->pop(node.data2);
            if (node.data1 == 0x51) {
              if (midi->tempo == 0) {
                for (int i = 0; i < node.data2; i++) {
                  midi->tempo = midi->tempo << 8;
                  midi->tempo |= node.buffer->pop<uint8_t>();
                }
              }
            }
          }
          break;
      }

      midi->nodes.push_back(node);
    } else {
      time += type;
    }
  }

  return buffer->get_size();
}